

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

char * deqp::gles2::Functional::FboConfig::getFormatName(GLenum format)

{
  switch(format) {
  case 0x1906:
    return "alpha";
  case 0x1907:
    return "rgb";
  case 0x1908:
    return "rgba";
  case 0x1909:
    return "luminance";
  case 0x190a:
    return "luminance_alpha";
  }
  if (format == 0x8056) {
    return "rgba4";
  }
  if (format == 0x8057) {
    return "rgb5_a1";
  }
  if (format == 0x81a5) {
    return "depth_component16";
  }
  if (format == 0x881a) {
    return "rgba16f";
  }
  if (format == 0x881b) {
    return "rgb16f";
  }
  if (format == 0x8d48) {
    return "stencil_index8";
  }
  if (format != 0x8d62) {
    return (char *)0x0;
  }
  return "rgb565";
}

Assistant:

const char* FboConfig::getFormatName (GLenum format)
{
	switch (format)
	{
		case GL_RGB:				return "rgb";
		case GL_RGBA:				return "rgba";
		case GL_ALPHA:				return "alpha";
		case GL_LUMINANCE:			return "luminance";
		case GL_LUMINANCE_ALPHA:	return "luminance_alpha";
		case GL_RGB565:				return "rgb565";
		case GL_RGB5_A1:			return "rgb5_a1";
		case GL_RGBA4:				return "rgba4";
		case GL_RGBA16F:			return "rgba16f";
		case GL_RGB16F:				return "rgb16f";
		case GL_DEPTH_COMPONENT16:	return "depth_component16";
		case GL_STENCIL_INDEX8:		return "stencil_index8";
		default:					DE_ASSERT(false); return DE_NULL;
	}
}